

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<ProKey,QMakeInternal::QMakeBuiltin>::emplace<QMakeInternal::QMakeBuiltin_const&>
          (QHash<ProKey,QMakeInternal::QMakeBuiltin> *this,ProKey *key,QMakeBuiltin *args)

{
  Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QMakeBuiltin local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0) {
    local_50.usage.d.d = (Data *)0x0;
LAB_00274840:
    pDVar1 = (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0;
LAB_00274862:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> **)this = pDVar1;
LAB_0027486a:
    pVar2 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>(this,key,args);
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::~QHash
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)&local_50);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_50.usage.d.d = (Data *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0)
        goto LAB_00274840;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_00274862;
      goto LAB_0027486a;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_00274926;
    }
    local_50.usage.d.d = (args->usage).d.d;
    local_50.usage.d.ptr = (args->usage).d.ptr;
    local_50.usage.d.size = (args->usage).d.size;
    if ((Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)local_50.usage.d.d !=
        (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0) {
      LOCK();
      (((QArrayData *)
       &((Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)local_50.usage.d.d)->ref)
      ->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)local_50.usage.d.d)
             ->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.maxArgs = args->maxArgs;
    local_50.index = args->index;
    local_50.minArgs = args->minArgs;
    pVar2 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::
                   emplace_helper<QMakeInternal::QMakeBuiltin>
                             ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)this,key,&local_50);
    if ((Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)local_50.usage.d.d !=
        (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0) {
      LOCK();
      (((RefCount *)&(local_50.usage.d.d)->super_QArrayData)->atomic)._q_value.
      super___atomic_base<int>._M_i =
           (((RefCount *)&(local_50.usage.d.d)->super_QArrayData)->atomic)._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((RefCount *)&(local_50.usage.d.d)->super_QArrayData)->atomic)._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.usage.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_00274926:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }